

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::DirectStateAccess::Textures::StorageErrorsTest::Test3DMultisample(StorageErrorsTest *this)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  int iVar12;
  undefined8 in_RAX;
  uint uVar14;
  undefined4 extraout_var;
  ErrorsUtilities *pEVar15;
  ulong uVar16;
  long lVar13;
  
  uVar14 = (uint)((ulong)in_RAX >> 0x20);
  iVar12 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar13 = CONCAT44(extraout_var,iVar12);
  pEVar15 = (ErrorsUtilities *)(ulong)this->m_to_invalid;
  uVar16 = (ulong)uVar14 << 0x20;
  (**(code **)(lVar13 + 0x1478))(pEVar15,1,0x8229,8,8,8,uVar16);
  bVar1 = ErrorsUtilities::CheckErrorAndLog
                    (pEVar15,(this->super_TestCase).m_context,0x502,"glTextureStorage3DMultisample",
                     "texture is not the name of an existing texture object.");
  pEVar15 = (ErrorsUtilities *)(ulong)this->m_to_3D_ms;
  uVar16 = uVar16 & 0xffffffff00000000;
  (**(code **)(lVar13 + 0x1478))(pEVar15,1,this->m_internalformat_invalid,8,8,8,uVar16);
  bVar2 = ErrorsUtilities::CheckErrorAndLog
                    (pEVar15,(this->super_TestCase).m_context,0x500,"glTextureStorage3DMultisample",
                     "internalformat is not a valid sized internal format.");
  pEVar15 = (ErrorsUtilities *)(ulong)this->m_to_1D;
  uVar16 = uVar16 & 0xffffffff00000000;
  (**(code **)(lVar13 + 0x1478))(pEVar15,1,0x8229,8,8,8,uVar16);
  bVar3 = ErrorsUtilities::CheckErrorAndLog
                    (pEVar15,(this->super_TestCase).m_context,0x500,"glTextureStorage3DMultisample",
                     "the effective target of texture is not one of the accepted targets.");
  pEVar15 = (ErrorsUtilities *)(ulong)this->m_to_3D_ms;
  uVar16 = uVar16 & 0xffffffff00000000;
  (**(code **)(lVar13 + 0x1478))(pEVar15,1,0x8229,0,8,8,uVar16);
  bVar4 = ErrorsUtilities::CheckErrorAndLog
                    (pEVar15,(this->super_TestCase).m_context,0x501,"glTextureStorage3DMultisample",
                     "width is less than 1.");
  pEVar15 = (ErrorsUtilities *)(ulong)this->m_to_3D_ms;
  uVar16 = uVar16 & 0xffffffff00000000;
  (**(code **)(lVar13 + 0x1478))(pEVar15,1,0x8229,8,0,8,uVar16);
  bVar5 = ErrorsUtilities::CheckErrorAndLog
                    (pEVar15,(this->super_TestCase).m_context,0x501,"glTextureStorage3DMultisample",
                     "height is less than 1.");
  pEVar15 = (ErrorsUtilities *)(ulong)this->m_to_3D_ms;
  uVar16 = uVar16 & 0xffffffff00000000;
  (**(code **)(lVar13 + 0x1478))(pEVar15,1,0x8229,this->m_max_texture_size * 2,8,8,uVar16);
  bVar6 = ErrorsUtilities::CheckErrorAndLog
                    (pEVar15,(this->super_TestCase).m_context,0x501,"glTextureStorage3DMultisample",
                     "width is greater than the value of MAX_TEXTURE_SIZE.");
  pEVar15 = (ErrorsUtilities *)(ulong)this->m_to_3D_ms;
  uVar16 = uVar16 & 0xffffffff00000000;
  (**(code **)(lVar13 + 0x1478))(pEVar15,1,0x8229,8,this->m_max_texture_size * 2,8,uVar16);
  bVar7 = ErrorsUtilities::CheckErrorAndLog
                    (pEVar15,(this->super_TestCase).m_context,0x501,"glTextureStorage3DMultisample",
                     "height is greater than the value of MAX_TEXTURE_SIZE.");
  pEVar15 = (ErrorsUtilities *)(ulong)this->m_to_3D_ms;
  uVar16 = uVar16 & 0xffffffff00000000;
  (**(code **)(lVar13 + 0x1478))(pEVar15,1,0x8229,8,8,0,uVar16);
  bVar8 = ErrorsUtilities::CheckErrorAndLog
                    (pEVar15,(this->super_TestCase).m_context,0x501,"glTextureStorage3DMultisample",
                     "depth is less than 1.");
  pEVar15 = (ErrorsUtilities *)(ulong)this->m_to_3D_ms;
  uVar16 = uVar16 & 0xffffffff00000000;
  (**(code **)(lVar13 + 0x1478))(pEVar15,1,0x8229,8,8,this->m_max_array_texture_layers * 2,uVar16);
  bVar9 = ErrorsUtilities::CheckErrorAndLog
                    (pEVar15,(this->super_TestCase).m_context,0x501,"glTextureStorage3DMultisample",
                     "depth is greater than the value of MAX_ARRAY_TEXTURE_LAYERS.");
  pEVar15 = (ErrorsUtilities *)(ulong)this->m_to_3D_ms;
  uVar16 = uVar16 & 0xffffffff00000000;
  (**(code **)(lVar13 + 0x1478))(pEVar15,this->m_max_samples * 2,0x8229,8,8,8,uVar16);
  bVar10 = ErrorsUtilities::CheckErrorAndLog
                     (pEVar15,(this->super_TestCase).m_context,0x501,"glTextureStorage3DMultisample"
                      ,"samples is greater than the value of MAX_SAMPLES.");
  pEVar15 = (ErrorsUtilities *)(ulong)this->m_to_3D_ms_immutable;
  (**(code **)(lVar13 + 0x1478))(pEVar15,1,0x8229,8,8,8,uVar16 & 0xffffffff00000000);
  bVar11 = ErrorsUtilities::CheckErrorAndLog
                     (pEVar15,(this->super_TestCase).m_context,0x502,"glTextureStorage3DMultisample"
                      ,"samples is greater than the value of MAX_SAMPLES.");
  return (bVar11 && (bVar10 && (bVar9 && bVar8))) &&
         ((bVar7 && (bVar6 && bVar5)) && ((bVar4 && bVar3) && (bVar2 && bVar1)));
}

Assistant:

bool StorageErrorsTest::Test3DMultisample()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Result. */
	bool is_ok = true;

	/*  Check that INVALID_OPERATION is generated by TextureStorage3DMultisample
	 if texture is not the name of an existing texture object. */
	{
		gl.textureStorage3DMultisample(m_to_invalid, 1, GL_R8, 8, 8, 8, false);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_OPERATION, "glTextureStorage3DMultisample",
								  "texture is not the name of an existing texture object.");
	}

	/*  Check that INVALID_ENUM is generated by TextureStorage3DMultisample if
	 internalformat is not a valid color-renderable, depth-renderable or
	 stencil-renderable format. */
	{
		gl.textureStorage3DMultisample(m_to_3D_ms, 1, m_internalformat_invalid, 8, 8, 8, false);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_ENUM, "glTextureStorage3DMultisample",
								  "internalformat is not a valid sized internal format.");
	}

	/*  Check that INVALID_ENUM is generated by TextureStorage3DMultisample if
	 target or the effective target of texture is not one of the accepted
	 targets described above. */
	{
		gl.textureStorage3DMultisample(m_to_1D, 1, GL_R8, 8, 8, 8, false);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_ENUM, "glTextureStorage3DMultisample",
								  "the effective target of texture is not one of the accepted targets.");
	}

	/* Check that INVALID_VALUE is generated by TextureStorage3DMultisample if
	 width or height are less than 1 or greater than the value of
	 MAX_TEXTURE_SIZE. */
	{
		gl.textureStorage3DMultisample(m_to_3D_ms, 1, GL_R8, 0, 8, 8, false);
		is_ok &=
			CheckErrorAndLog(m_context, GL_INVALID_VALUE, "glTextureStorage3DMultisample", "width is less than 1.");

		gl.textureStorage3DMultisample(m_to_3D_ms, 1, GL_R8, 8, 0, 8, false);
		is_ok &=
			CheckErrorAndLog(m_context, GL_INVALID_VALUE, "glTextureStorage3DMultisample", "height is less than 1.");

		gl.textureStorage3DMultisample(m_to_3D_ms, 1, GL_R8, m_max_texture_size * 2, 8, 8, false);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_VALUE, "glTextureStorage3DMultisample",
								  "width is greater than the value of MAX_TEXTURE_SIZE.");

		gl.textureStorage3DMultisample(m_to_3D_ms, 1, GL_R8, 8, m_max_texture_size * 2, 8, false);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_VALUE, "glTextureStorage3DMultisample",
								  "height is greater than the value of MAX_TEXTURE_SIZE.");
	}

	/* Check that INVALID_VALUE is generated by TextureStorage3DMultisample if
	 depth is less than 1 or greater than the value of
	 MAX_ARRAY_TEXTURE_LAYERS. */
	{
		gl.textureStorage3DMultisample(m_to_3D_ms, 1, GL_R8, 8, 8, 0, false);
		is_ok &=
			CheckErrorAndLog(m_context, GL_INVALID_VALUE, "glTextureStorage3DMultisample", "depth is less than 1.");

		gl.textureStorage3DMultisample(m_to_3D_ms, 1, GL_R8, 8, 8, m_max_array_texture_layers * 2, false);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_VALUE, "glTextureStorage3DMultisample",
								  "depth is greater than the value of MAX_ARRAY_TEXTURE_LAYERS.");
	}

	/* Check that INVALID_VALUE is generated by TextureStorage3DMultisample if
	 samples is greater than the value of MAX_SAMPLES. */
	{
		gl.textureStorage3DMultisample(m_to_3D_ms, m_max_samples * 2, GL_R8, 8, 8, 8, false);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_VALUE, "glTextureStorage3DMultisample",
								  "samples is greater than the value of MAX_SAMPLES.");
	}

	/* Check that INVALID_OPERATION is generated by TextureStorage3DMultisample
	 if the value of TEXTURE_IMMUTABLE_FORMAT for the texture bound to target
	 is not FALSE. */
	{
		gl.textureStorage3DMultisample(m_to_3D_ms_immutable, 1, GL_R8, 8, 8, 8, false);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_OPERATION, "glTextureStorage3DMultisample",
								  "samples is greater than the value of MAX_SAMPLES.");
	}

	return is_ok;
}